

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall leveldb::CorruptionTest::RepairDB(CorruptionTest *this)

{
  Status local_1b8;
  Tester local_1b0;
  CorruptionTest *local_10;
  CorruptionTest *this_local;
  
  local_10 = this;
  if (this->db_ != (DB *)0x0) {
    (*this->db_->_vptr_DB[1])();
  }
  this->db_ = (DB *)0x0;
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x36);
  leveldb::RepairDB((leveldb *)&local_1b8,&this->dbname_,&this->options_);
  test::Tester::IsOk(&local_1b0,&local_1b8);
  Status::~Status(&local_1b8);
  test::Tester::~Tester(&local_1b0);
  return;
}

Assistant:

void RepairDB() {
    delete db_;
    db_ = nullptr;
    ASSERT_OK(::leveldb::RepairDB(dbname_, options_));
  }